

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromName(CSceneManager *this,char *name,ISceneNode *start)

{
  __optional_eq_t<std::__cxx11::basic_string<char>,_const_char_*> _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *plVar3;
  _List_node_base *p_Var4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  startName;
  char *local_48;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  local_48 = name;
  if (start == (ISceneNode *)0x0) {
    iVar2 = (*(this->super_ISceneManager)._vptr_ISceneManager[9])(this);
    start = (ISceneNode *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*start->_vptr_ISceneNode[5])(start);
  ::std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_40,
                   (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)CONCAT44(extraout_var_00,iVar2));
  if ((local_40._M_engaged != true) ||
     (_Var1 = ::std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_40,&local_48), !_Var1)) {
    plVar3 = &start->Children;
    p_Var4 = (_List_node_base *)plVar3;
    do {
      p_Var4 = (((_List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)plVar3) {
        start = (ISceneNode *)0x0;
        break;
      }
      iVar2 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xb])
                        (this,local_48,p_Var4[1]._M_next);
      start = (ISceneNode *)CONCAT44(extraout_var_01,iVar2);
    } while (start == (ISceneNode *)0x0);
  }
  ::std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_40);
  return start;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromName(const char *name, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	auto startName = start->getName();
	if (startName.has_value() && startName == name)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromName(name, *it);
		if (node)
			return node;
	}

	return 0;
}